

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_RangeCtorSanity_Test::~Btree_RangeCtorSanity_Test
          (Btree_RangeCtorSanity_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, RangeCtorSanity) {
        std::vector<int> ivec;
        ivec.push_back(1);
        std::map<int, int> imap;
        imap.insert(std::make_pair(1, 2));
        phmap::btree_multiset<int> tmset(ivec.begin(), ivec.end());
        phmap::btree_multimap<int, int> tmmap(imap.begin(), imap.end());
        phmap::btree_set<int> tset(ivec.begin(), ivec.end());
        phmap::btree_map<int, int> tmap(imap.begin(), imap.end());
        EXPECT_EQ(1, tmset.size());
        EXPECT_EQ(1, tmmap.size());
        EXPECT_EQ(1, tset.size());
        EXPECT_EQ(1, tmap.size());
    }